

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O1

void show_shifts(void)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  shifts *psVar4;
  
  if (first_shift != (shifts *)0x0) {
    uVar2 = 0;
    psVar4 = first_shift;
    do {
      if (uVar2 != 0) {
        putchar(10);
      }
      printf("shift %d, number = %d, nshifts = %d\n",(ulong)uVar2,(ulong)(uint)psVar4->number,
             (ulong)(uint)psVar4->nshifts);
      iVar1 = psVar4->nshifts;
      if (0 < (long)iVar1) {
        lVar3 = 0;
        do {
          printf("\t%d\n",(ulong)(uint)psVar4->shift[lVar3]);
          lVar3 = lVar3 + 1;
        } while (iVar1 != lVar3);
      }
      uVar2 = uVar2 + 1;
      psVar4 = psVar4->next;
    } while (psVar4 != (shifts *)0x0);
  }
  return;
}

Assistant:

void show_shifts()
{
    shifts *p;
    int i, j, k;

    k = 0;
    for (p = first_shift; p; ++k, p = p->next)
    {
	if (k) printf("\n");
	printf("shift %d, number = %d, nshifts = %d\n", k, p->number,
		p->nshifts);
	j = p->nshifts;
	for (i = 0; i < j; ++i)
	    printf("\t%d\n", p->shift[i]);
    }
}